

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O0

void __thiscall
TPZEqnArray<double>::EqnBackward(TPZEqnArray<double> *this,TPZFMatrix<double> *U,DecomposeType dec)

{
  double dVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  double *pdVar5;
  int in_EDX;
  TPZFMatrix<double> *in_RSI;
  TPZEqnArray<double> *in_RDI;
  int i_1;
  double acum_1;
  int last_term_1;
  int index_1;
  int i;
  double acum;
  int last_term;
  int index;
  int n;
  TPZFMatrix<double> *in_stack_ffffffffffffff60;
  double in_stack_ffffffffffffff68;
  TPZFMatrix<double> *in_stack_ffffffffffffff70;
  int local_44;
  double local_40;
  int local_2c;
  double local_28;
  int local_18;
  
  iVar3 = IsSymmetric(in_RDI);
  if (iVar3 == 1) {
    iVar3 = in_RDI->fNumEq;
    while (local_18 = iVar3 + -1, -1 < local_18) {
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
      iVar2 = *piVar4;
      piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)iVar3);
      iVar3 = *piVar4;
      local_28 = 0.0;
      local_2c = iVar2;
      while (local_2c = local_2c + 1, local_2c < iVar3) {
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_2c);
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                            (int64_t)in_stack_ffffffffffffff60);
        dVar1 = *pdVar5;
        pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI->fEqValues,(long)local_2c);
        local_28 = -dVar1 * *pdVar5 + local_28;
      }
      TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)iVar2);
      pdVar5 = TPZFMatrix<double>::operator()
                         (in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                          (int64_t)in_stack_ffffffffffffff60);
      *pdVar5 = local_28 + *pdVar5;
      iVar3 = local_18;
      if (in_EDX == 3) {
        pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI->fEqValues,(long)iVar2);
        dVar1 = *pdVar5;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)iVar2);
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                            (int64_t)in_stack_ffffffffffffff60);
        *pdVar5 = *pdVar5 / dVar1;
      }
    }
  }
  else {
    iVar3 = IsSymmetric(in_RDI);
    if (iVar3 == 2) {
      iVar3 = in_RDI->fNumEq;
      while (local_18 = iVar3 + -2, -1 < local_18) {
        piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)local_18);
        iVar2 = *piVar4;
        piVar4 = TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fEqStart,(long)(iVar3 + -1));
        iVar3 = *piVar4;
        local_40 = 0.0;
        local_44 = iVar2;
        while (local_44 = local_44 + 1, local_44 < iVar3) {
          in_stack_ffffffffffffff70 = in_RSI;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)local_44);
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffff70,(int64_t)in_stack_ffffffffffffff68,
                              (int64_t)in_stack_ffffffffffffff60);
          dVar1 = *pdVar5;
          pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI->fEqValues,(long)local_44);
          local_40 = -dVar1 * *pdVar5 + local_40;
        }
        in_stack_ffffffffffffff60 = in_RSI;
        TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)iVar2);
        pdVar5 = TPZFMatrix<double>::operator()
                           (in_stack_ffffffffffffff70,(int64_t)local_40,
                            (int64_t)in_stack_ffffffffffffff60);
        *pdVar5 = local_40 + *pdVar5;
        iVar3 = local_18;
        if ((in_EDX == 3) || (in_stack_ffffffffffffff68 = local_40, in_EDX == 1)) {
          pdVar5 = TPZVec<double>::operator[]((TPZVec<double> *)&in_RDI->fEqValues,(long)iVar2);
          dVar1 = *pdVar5;
          TPZVec<int>::operator[]((TPZVec<int> *)&in_RDI->fIndex,(long)iVar2);
          pdVar5 = TPZFMatrix<double>::operator()
                             (in_stack_ffffffffffffff70,(int64_t)local_40,
                              (int64_t)in_stack_ffffffffffffff60);
          *pdVar5 = *pdVar5 / dVar1;
          in_stack_ffffffffffffff68 = local_40;
        }
      }
    }
  }
  return;
}

Assistant:

void TPZEqnArray<TVar>::EqnBackward(TPZFMatrix<TVar> & U, DecomposeType dec) {
	int n;
	if(IsSymmetric()==EIsSymmetric){
    	for(n=fNumEq-1; n>=0; n--) {
    		int index = fEqStart[n]; 
    		int last_term = fEqStart[n + 1];
    		TVar acum = 0.;
    		int i;
    		for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky){
               	U(fIndex[index],0) /= fEqValues[index];
    		}
    	}
	}else if(IsSymmetric()==EIsNonSymmetric){
        for(n=fNumEq-2; n>=0; n-=2) {
            int index = fEqStart[n];
            int last_term = fEqStart[n + 1];
            TVar acum = 0.;
            int i;
            for(i = index + 1; i < last_term; i++) acum -= U(fIndex[i],0) * fEqValues[i];
			
            /** Case LU - LDLT - Cholesky*/
            U(fIndex[index],0) += acum;
			
            /** Case Cholesky */
            if(dec == ECholesky || dec == ELU){
                U(fIndex[index],0) /= fEqValues[index];
            }
        }
    }
}